

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

void sha512(void *in,unsigned_long inlen,void *out)

{
  sha512_state ctx;
  sha512_state local_e0;
  
  local_e0.curlen = 0;
  local_e0.length = 0;
  local_e0.state[0] = 0x6a09e667f3bcc908;
  local_e0.state[1] = 0xbb67ae8584caa73b;
  local_e0.state[2] = 0x3c6ef372fe94f82b;
  local_e0.state[3] = 0xa54ff53a5f1d36f1;
  local_e0.state[4] = 0x510e527fade682d1;
  local_e0.state[5] = 0x9b05688c2b3e6c1f;
  local_e0.state[6] = 0x1f83d9abfb41bd6b;
  local_e0.state[7] = 0x5be0cd19137e2179;
  sha512_process(&local_e0,(uchar *)in,inlen);
  sha512_done(&local_e0,(uchar *)out);
  return;
}

Assistant:

void sha512(const void *in, unsigned long inlen, void* out)
{
    struct sha512_state ctx;
    sha512_init(&ctx);
    sha512_process(&ctx, (const unsigned char*)in, inlen);
    sha512_done(&ctx, (unsigned char *)out);
}